

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set
          (Option *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *target,string_view param_3,string_view value)

{
  string_view value_00;
  bool bVar1;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> entry;
  iterator __end1;
  iterator __begin1;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range1;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *in_stack_fffffffffffffee8;
  string *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem_00;
  undefined1 allowCommaList;
  size_t in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  local_a8 [3];
  undefined1 local_8c [36];
  undefined1 *local_68;
  undefined1 local_60 [96];
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000008;
  allowCommaList = (undefined1)((ulong)local_60 >> 0x38);
  __args = in_RDI;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x5a2788);
  local_8c._4_8_ = (this_00->_M_dataplus)._M_p;
  local_8c._12_8_ = this_00->_M_string_length;
  splitMem_00 = (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)local_8c;
  bitmask<slang::CommandLineFlags>::bitmask
            ((bitmask<slang::CommandLineFlags> *)splitMem_00,CommaList);
  bitmask<slang::CommandLineFlags>::has
            ((bitmask<slang::CommandLineFlags> *)in_RDI,
             (bitmask<slang::CommandLineFlags> *)in_stack_fffffffffffffee8);
  value_00._M_str = in_stack_ffffffffffffff30;
  value_00._M_len = in_stack_ffffffffffffff28;
  local_8c._20_16_ = (undefined1  [16])parseList(value_00,(bool)allowCommaList,splitMem_00);
  local_68 = local_8c + 0x14;
  local_a8[0]._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
       begin(in_stack_fffffffffffffee8);
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *)
      __args);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffee8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator*(local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,(basic_string_view<char,_std::char_traits<char>_> *)__args);
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator++(local_a8);
  }
  std::__cxx11::string::string(this_00);
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::~SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x5a28c7);
  return __args;
}

Assistant:

std::string CommandLine::Option::set(std::vector<std::string>& target, std::string_view,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem))
        target.emplace_back(entry);
    return {};
}